

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Sprs_array_row_distribution64(int s_a,int iproc,int64_t *lo,int64_t *hi)

{
  Integer ihi;
  Integer ilo;
  int64_t local_30;
  int64_t local_28;
  
  pnga_sprs_array_row_distribution((long)s_a,(long)iproc,&local_28,&local_30);
  *lo = local_28;
  *hi = local_30;
  return;
}

Assistant:

void NGA_Sprs_array_row_distribution64(int s_a, int iproc, int64_t *lo, int64_t *hi)
{
  Integer sa = (Integer)s_a;
  Integer ip = (Integer)iproc;
  Integer ilo, ihi;
  wnga_sprs_array_row_distribution(sa,ip,&ilo,&ihi);
  *lo = (int64_t)ilo;
  *hi = (int64_t)ihi;
}